

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O3

shared_ptr<vmips::MemoryLocation> __thiscall vmips::Function::new_memory(Function *this,size_t size)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 *puVar2;
  undefined8 in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<vmips::MemoryLocation> sVar3;
  undefined8 local_38;
  undefined8 uStack_30;
  
  puVar2 = (undefined8 *)operator_new(0x48);
  puVar2[1] = 0x100000001;
  *puVar2 = &PTR___Sp_counted_ptr_inplace_00132960;
  puVar2[5] = 0;
  puVar2[6] = 0;
  puVar2[7] = 0;
  puVar2[8] = 0;
  puVar2[6] = 0;
  puVar2[7] = 0;
  (this->name)._M_string_length = (size_type)puVar2;
  (this->name)._M_dataplus._M_p = (pointer)(puVar2 + 2);
  puVar2[4] = in_RDX;
  lVar1 = *(long *)(size + 0x28);
  *(long *)(size + 0x28) = lVar1 + 1;
  puVar2[2] = lVar1;
  *(undefined4 *)(puVar2 + 8) = 1;
  puVar2[3] = 0xffffffffffffffff;
  get_special((vmips *)&local_38,s8);
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar2[7];
  puVar2[6] = local_38;
  puVar2[7] = uStack_30;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::
  vector<std::shared_ptr<vmips::MemoryLocation>,_std::allocator<std::shared_ptr<vmips::MemoryLocation>_>_>
  ::push_back((vector<std::shared_ptr<vmips::MemoryLocation>,_std::allocator<std::shared_ptr<vmips::MemoryLocation>_>_>
               *)(size + 0xf0),(value_type *)this);
  sVar3.super___shared_ptr<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<vmips::MemoryLocation>)
         sVar3.super___shared_ptr<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MemoryLocation> Function::new_memory(size_t size) {
    auto res = std::make_shared<MemoryLocation>();
    res->size = size;
    res->identifier = memory_count++;
    res->status = MemoryLocation::Undetermined;
    res->offset = -1;
    res->base = get_special(SpecialReg::s8);
    mem_blocks.push_back(res);
    return res;
}